

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplace_back<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,SourceLocation *args,SourceLocation *args_1)

{
  iterator this_00;
  SourceLocation *in_RDX;
  SourceLocation *in_RSI;
  SmallVectorBase<slang::SourceRange> *in_RDI;
  SourceLocation *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<slang::SourceRange> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::SourceLocation&,slang::SourceLocation&>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,
                         (SourceLocation *)this);
  }
  else {
    this_00 = end(in_RDI);
    SourceRange::SourceRange(this_00,*in_RSI,*in_RDX);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }